

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMAttrMapImpl::reconcileDefaultAttributes
          (DOMAttrMapImpl *this,DOMAttrMapImpl *defaults)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar4;
  long lVar5;
  
  iVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  while (lVar5 != 0) {
    lVar5 = lVar5 + -1;
    iVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(this,lVar5);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x148))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    if (cVar1 == '\0') {
      (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0x10])(this,lVar5);
    }
  }
  (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this,0);
  if (defaults != (DOMAttrMapImpl *)0x0) {
    (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this,1);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])(this,defaults);
      return;
    }
    iVar2 = (*(defaults->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])(defaults);
    if (CONCAT44(extraout_var_01,iVar2) != 0) {
      lVar5 = 0;
      do {
        iVar3 = (*(defaults->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(defaults,lVar5);
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x68))
                                   ((long *)CONCAT44(extraout_var_02,iVar3),1);
        (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[8])(this,plVar4);
        (**(code **)(*plVar4 + 0x198))(plVar4,0);
        lVar5 = lVar5 + 1;
      } while (CONCAT44(extraout_var_01,iVar2) != lVar5);
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::reconcileDefaultAttributes(const DOMAttrMapImpl* defaults) {

    // remove any existing default
    XMLSize_t nsize = getLength();
    for (XMLSize_t i = nsize; i > 0; i--) {
        DOMAttr* attr = (DOMAttr*)item(i-1);
        if (!attr->getSpecified()) {
            removeNamedItemAt(i-1);
        }
    }

    hasDefaults(false);

    // add the new defaults
    if (defaults) {
        hasDefaults(true);

        if (nsize == 0) {
            cloneContent(defaults);
        }
        else {
            XMLSize_t dsize = defaults->getLength();
            for (XMLSize_t n = 0; n < dsize; n++) {
                DOMAttr* attr = (DOMAttr*)defaults->item(n);

                DOMAttr* newAttr = (DOMAttr*)attr->cloneNode(true);
                setNamedItemNS(newAttr);
                DOMAttrImpl* newAttrImpl = (DOMAttrImpl*) newAttr;
                newAttrImpl->setSpecified(false);
            }
        }
    }
}